

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O0

void __thiscall
robin_hood::detail::
Table<true,_80UL,_Rml::Element_*,_itlib::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>_>_>,_robin_hood::hash<Rml::Element_*,_void>,_std::equal_to<Rml::Element_*>_>
::destroy(Table<true,_80UL,_Rml::Element_*,_itlib::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>_>_>,_robin_hood::hash<Rml::Element_*,_void>,_std::equal_to<Rml::Element_*>_>
          *this)

{
  DataNode<robin_hood::detail::Table<true,_80UL,_Rml::Element_*,_itlib::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>_>_>,_robin_hood::hash<Rml::Element_*,_void>,_std::equal_to<Rml::Element_*>_>,_true>
  *pDVar1;
  DataNode<robin_hood::detail::Table<true,_80UL,_Rml::Element_*,_itlib::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>_>_>,_robin_hood::hash<Rml::Element_*,_void>,_std::equal_to<Rml::Element_*>_>,_true>
  *pDVar2;
  Destroyer<robin_hood::detail::Table<true,_80UL,_Rml::Element_*,_itlib::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>_>_>,_robin_hood::hash<Rml::Element_*,_void>,_std::equal_to<Rml::Element_*>_>,_false>
  local_11;
  Table<true,_80UL,_Rml::Element_*,_itlib::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>_>_>,_robin_hood::hash<Rml::Element_*,_void>,_std::equal_to<Rml::Element_*>_>
  *local_10;
  Table<true,_80UL,_Rml::Element_*,_itlib::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>_>_>,_robin_hood::hash<Rml::Element_*,_void>,_std::equal_to<Rml::Element_*>_>
  *this_local;
  
  if (this->mMask != 0) {
    local_10 = this;
    Destroyer<robin_hood::detail::Table<true,_80UL,_Rml::Element_*,_itlib::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>_>_>,_robin_hood::hash<Rml::Element_*,_void>,_std::equal_to<Rml::Element_*>_>,_false>
    ::nodesDoNotDeallocate(&local_11,this);
    pDVar1 = this->mKeyVals;
    pDVar2 = reinterpret_cast_no_cast_align_warning<robin_hood::detail::Table<true,80ul,Rml::Element*,itlib::flat_map<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>>>>,robin_hood::hash<Rml::Element*,void>,std::equal_to<Rml::Element*>>::DataNode<robin_hood::detail::Table<true,80ul,Rml::Element*,itlib::flat_map<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>>>>,robin_hood::hash<Rml::Element*,void>,std::equal_to<Rml::Element*>>,true>*>
                       (&this->mMask);
    if (pDVar1 != pDVar2) {
      free(this->mKeyVals);
    }
  }
  return;
}

Assistant:

void destroy() {
        if (0 == mMask) {
            // don't deallocate!
            return;
        }

        Destroyer<Self, IsFlat && std::is_trivially_destructible<Node>::value>{}
            .nodesDoNotDeallocate(*this);

        // This protection against not deleting mMask shouldn't be needed as it's sufficiently
        // protected with the 0==mMask check, but I have this anyways because g++ 7 otherwise
        // reports a compile error: attempt to free a non-heap object 'fm'
        // [-Werror=free-nonheap-object]
        if (mKeyVals != reinterpret_cast_no_cast_align_warning<Node*>(&mMask)) {
            std::free(mKeyVals);
        }
    }